

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void makecorridors(level *lev,int style)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  mkroom *pmVar5;
  int local_48;
  int r_1;
  int grid_height;
  int cy;
  int cx;
  mkroom *r;
  int local_28;
  int mindist;
  int cnt;
  int iStack_1c;
  boolean any;
  int i;
  int b;
  int a;
  int style_local;
  level *lev_local;
  
  bVar2 = true;
  switch(style) {
  case 0:
  default:
    for (i = 0; i < lev->nroom + -1; i = i + 1) {
      join(lev,i,i + 1,'\0');
      iVar3 = rn2(0x32);
      if (iVar3 == 0) break;
    }
    for (i = 0; i < lev->nroom + -2; i = i + 1) {
      if (smeq[i] != smeq[i + 2]) {
        join(lev,i,i + 2,'\0');
      }
    }
    i = 0;
    while( true ) {
      bVar1 = false;
      if (bVar2) {
        bVar1 = i < lev->nroom;
      }
      if (!bVar1) break;
      bVar2 = false;
      for (iStack_1c = 0; iStack_1c < lev->nroom; iStack_1c = iStack_1c + 1) {
        if (smeq[i] != smeq[iStack_1c]) {
          join(lev,i,iStack_1c,'\0');
          bVar2 = true;
        }
      }
      i = i + 1;
    }
    if (2 < lev->nroom) {
      iVar3 = rn2(lev->nroom);
      for (cnt = iVar3 + 4; cnt != 0; cnt = cnt + -1) {
        iVar3 = rn2(lev->nroom);
        iStack_1c = rn2(lev->nroom + -2);
        if (iVar3 <= iStack_1c) {
          iStack_1c = iStack_1c + 2;
        }
        join(lev,iVar3,iStack_1c,'\x01');
      }
    }
    break;
  case 1:
    if (1 < lev->nroom) {
      local_28 = 0;
      for (i = 0; i < lev->nroom; i = i + 1) {
        do {
          iStack_1c = rn2(lev->nroom + -1);
          if ((i == iStack_1c) || (bVar2 = false, lev->rooms[iStack_1c].doorct != '\0')) {
            bVar2 = local_28 < 100;
            local_28 = local_28 + 1;
          }
        } while (bVar2);
        if (99 < local_28) {
          for (iStack_1c = 0;
              (iStack_1c < lev->nroom + -1 &&
              ((lev->rooms[iStack_1c].doorct != '\0' || (i == iStack_1c))));
              iStack_1c = iStack_1c + 1) {
          }
        }
        if (i == iStack_1c) {
          iStack_1c = iStack_1c + 1;
        }
        join(lev,i,iStack_1c,'\0');
      }
    }
    break;
  case 2:
    for (i = 0; i < lev->nroom; i = i + 1) {
      join(lev,i,(i + 1) % lev->nroom,'\0');
    }
    break;
  case 3:
    if (1 < lev->nroom) {
      r._4_4_ = 9999;
      iStack_1c = 0;
      for (cnt = 0; cnt < lev->nroom; cnt = cnt + 1) {
        pmVar5 = lev->rooms + cnt;
        iVar3 = (int)pmVar5->lx + ((int)pmVar5->hx - (int)pmVar5->lx) / 2 + -0x28;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        iVar4 = (int)pmVar5->ly + ((int)pmVar5->hy - (int)pmVar5->ly) / 2 + -10;
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if (iVar3 + iVar4 < r._4_4_) {
          iStack_1c = cnt;
          r._4_4_ = iVar3 + iVar4;
        }
      }
      for (i = 0; iVar3 = iStack_1c, i < iStack_1c; i = i + 1) {
        join(lev,i,iStack_1c,'\0');
      }
      while (i = iVar3 + 1, i < lev->nroom) {
        join(lev,i,iStack_1c,'\0');
        iVar3 = i;
      }
    }
    break;
  case 4:
    iVar3 = 2;
    if (lev->rooms[0].lx == lev->rooms[2].lx) {
      iVar3 = 3;
    }
    for (i = 0; i < lev->nroom - iVar3; i = iVar3 + i) {
      local_48 = rn2(iVar3);
      join(lev,i + local_48,i + local_48 + iVar3,'\0');
      for (iStack_1c = 1; iStack_1c < iVar3; iStack_1c = iStack_1c + 1) {
        iVar4 = rn2(4);
        if (iVar4 == 0) {
          local_48 = (local_48 + 1) % iVar3;
          join(lev,i + local_48,i + local_48 + iVar3,'\0');
        }
      }
    }
    for (iStack_1c = 0; iStack_1c < iVar3 + -1; iStack_1c = iStack_1c + 1) {
      local_48 = rn2(lev->nroom / iVar3);
      join(lev,iStack_1c + iVar3 * local_48,iStack_1c + iVar3 * local_48 + 1,'\0');
      for (i = 1; i < lev->nroom / iVar3; i = i + 1) {
        iVar4 = rn2(4);
        if (iVar4 == 0) {
          iVar4 = rn2(lev->nroom / iVar3 - i);
          local_48 = (local_48 + iVar4) % (lev->nroom / iVar3);
          while( true ) {
            bVar2 = false;
            if (smeq[iStack_1c + iVar3 * local_48] == smeq[iStack_1c + iVar3 * local_48 + 1]) {
              bVar2 = local_48 < (lev->nroom << 1) / iVar3;
            }
            if (!bVar2) break;
            local_48 = local_48 + 1;
          }
          local_48 = local_48 % (lev->nroom / iVar3);
          join(lev,iStack_1c + iVar3 * local_48,iStack_1c + iVar3 * local_48 + 1,'\0');
        }
      }
    }
    for (i = 0; i < lev->nroom; i = i + 1) {
      for (iStack_1c = i; smeq[smeq[iStack_1c]] < smeq[iStack_1c]; iStack_1c = smeq[iStack_1c]) {
        smeq[iStack_1c] = smeq[smeq[iStack_1c]];
      }
      if (smeq[iStack_1c] != 0) {
        if (i % iVar3 == 0) {
          join(lev,i,i - iVar3,'\0');
        }
        else {
          join(lev,i,i + -1,'\0');
        }
      }
    }
  }
  return;
}

Assistant:

void makecorridors(struct level *lev, int style)
{
	int a, b, i;
	boolean any = TRUE;

	switch (style) {
	case LEVSTYLE_STANDARD:
	default: /* vanilla style */
	    for (a = 0; a < lev->nroom - 1; a++) {
		join(lev, a, a + 1, FALSE);
		if (!rn2(50))
		    break; /* allow some randomness */
	    }
	    for (a = 0; a < lev->nroom - 2; a++) {
		if (smeq[a] != smeq[a + 2])
		    join(lev, a, a + 2, FALSE);
	    }
	    for (a = 0; any && a < lev->nroom; a++) {
		any = FALSE;
		for (b = 0; b < lev->nroom; b++) {
		    if (smeq[a] != smeq[b]) {
			join(lev, a, b, FALSE);
			any = TRUE;
		    }
		}
	    }
	    if (lev->nroom > 2) {
		for (i = rn2(lev->nroom) + 4; i; i--) {
		    a = rn2(lev->nroom);
		    b = rn2(lev->nroom - 2);
		    if (b >= a)
			b += 2;
		    join(lev, a, b, TRUE);
		}
	    }
	    break;

	case LEVSTYLE_ANYTOANY: /* at least one corridor leaves from each room
				 * and goes to a random room */
	    if (lev->nroom > 1) {
		int cnt = 0;
		for (a = 0; a < lev->nroom; a++) {
		    do {
			b = rn2(lev->nroom - 1);
		    } while ((a == b || lev->rooms[b].doorct) && cnt++ < 100);
		    if (cnt >= 100) {
			for (b = 0; b < lev->nroom - 1; b++) {
			    if (!lev->rooms[b].doorct && a != b)
				break;
			}
		    }
		    if (a == b)
			b++;
		    join(lev, a, b, FALSE);
		}
	    }
	    break;

	case LEVSTYLE_RING: /* circular path:
			     * room1 -> room2 -> room3 -> ... -> room1 */
	    for (a = 0; a < lev->nroom; a++) {
		b = (a + 1) % lev->nroom;
		join(lev, a, b, FALSE);
	    }
	    break;

	case LEVSTYLE_HUB: /* all roads lead to rome... or to the first room */
	    if (lev->nroom > 1) {
		/* find the most central room Manhattan-style */
		int mindist = 9999; /* arbitrary big number */
		b = 0;
		for (i = 0; i < lev->nroom; i++) {
		    struct mkroom *r = &lev->rooms[i];
		    int cx = abs(r->lx + (r->hx - r->lx) / 2 - COLNO / 2);
		    int cy = abs(r->ly + (r->hy - r->ly) / 2 - ROWNO / 2);
		    if (cx + cy < mindist) {
			b = i;
			mindist = cx + cy;
		    }
		}

		for (a = 0; a < b; a++)
		    join(lev, a, b, FALSE);
		for (a = b + 1; a < lev->nroom; a++)
		    join(lev, a, b, FALSE);
	    }
	    break;

	case LEVSTYLE_GRID: /* rooms should be in column-major order */
	    {
		/* First, we need to establish whether the grid height is 2 or 3. */
		int grid_height = (lev->rooms[0].lx == lev->rooms[2].lx) ? 3 : 2;
		int r;

		/* Make random horizontal joins, at least one per column. */
		for (a = 0; a < lev->nroom - grid_height; a += grid_height) {
		    r = rn2(grid_height);
		    join(lev, a + r, a + r + grid_height, FALSE);

		    for (b = 1; b < grid_height; b++) {
			if (!rn2(4)) {
			    r = (r + 1) % grid_height;
			    join(lev, a + r, a + r + grid_height, FALSE);
			}
		    }
		}

		/* Make vertical joins, at least one per row. */
		for (b = 0; b < grid_height - 1; b++) {
		    r = rn2(lev->nroom / grid_height);
		    join(lev, b+grid_height*r, b+grid_height*r+1, FALSE);

		    for (a = 1; a < lev->nroom / grid_height; a++) {
			if (!rn2(4)) {
			    /* Pick a random column. */
			    r = (r + rn2(lev->nroom / grid_height - a)) %
				(lev->nroom / grid_height);
			    /* Move along to one that isn't already joined. */
			    while (smeq[b+grid_height*r] == smeq[b+grid_height*r+1] &&
				   r < 2 * lev->nroom / grid_height) {
				r++;
			    }
			    r %= lev->nroom / grid_height;
			    /* Join it. */
			    join(lev, b+grid_height*r, b+grid_height*r+1, FALSE);
			}
		    }
		}

		/* Finally, just make sure that all rooms are connected. */
		for (a = 0; a < lev->nroom; a++) {
		    b = a;
		    while (smeq[b] > smeq[smeq[b]]) {
			smeq[b] = smeq[smeq[b]]; /* Just to speed up later checks. */
			b = smeq[b];
		    }
		    if (smeq[b] != 0) {
			/*
			 * Well, we know that the rooms before this one are connected
			 * to room 0...
			 */
			if (a % grid_height == 0) {
			    join(lev, a, a - grid_height, FALSE);
			} else {
			    join(lev, a, a - 1, FALSE);
			}
		    }
		}
	    }
	    break;
	}
}